

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  MessageFactory *pMVar2;
  int iVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  MessageLite *pMVar6;
  Descriptor *pDVar7;
  LogMessage local_b0;
  LogMessage local_78;
  MessageFactory *local_40;
  LogFinisher local_31;
  
  pEVar4 = FindOrNull(this,*(int *)(descriptor + 0x44));
  if (pEVar4 == (Extension *)0x0) {
    pMVar6 = (MessageLite *)0x0;
  }
  else {
    local_40 = factory;
    if (pEVar4->is_repeated == true) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set_heavy.cc"
                 ,200);
      pLVar5 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
      LogMessage::~LogMessage(&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar4->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set_heavy.cc"
                 ,200);
      pLVar5 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar5);
      LogMessage::~LogMessage(&local_78);
    }
    pMVar2 = local_40;
    if ((pEVar4->field_0xa & 0x10) == 0) {
      pMVar6 = (MessageLite *)(pEVar4->field_0).repeated_string_value;
      if (this->arena_ != (Arena *)0x0) {
        pMVar6 = (MessageLite *)
                 (*(code *)(((RepeatedPtrFieldBase *)&pMVar6->_vptr_MessageLite)->arena_->impl_).
                           initial_block_)(pMVar6);
        (*(code *)(((RepeatedPtrFieldBase *)&pMVar6->_vptr_MessageLite)->arena_->impl_).options_.
                  initial_block_size)(pMVar6,(pEVar4->field_0).int64_value);
      }
    }
    else {
      pRVar1 = (pEVar4->field_0).repeated_string_value;
      pDVar7 = FieldDescriptor::message_type(descriptor);
      iVar3 = (*pMVar2->_vptr_MessageFactory[2])(pMVar2,pDVar7);
      pMVar6 = (MessageLite *)
               (*(code *)(((pRVar1->super_RepeatedPtrFieldBase).arena_)->impl_).options_.
                         initial_block)(pRVar1,iVar3);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar4->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,*(int *)(descriptor + 0x44));
  }
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ != NULL) {
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      } else {
        ret = extension->message_value;
      }
    }
    Erase(descriptor->number());
    return ret;
  }
}